

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.cpp
# Opt level: O1

ostream * operator<<(ostream *out,Contact *ct)

{
  std::__ostream_insert<char,std::char_traits<char>>
            (out,(ct->name)._M_dataplus._M_p,(ct->name)._M_string_length);
  if ((ct->work_address)._M_t.super___uniq_ptr_impl<Address,_std::default_delete<Address>_>._M_t.
      super__Tuple_impl<0UL,_Address_*,_std::default_delete<Address>_>.
      super__Head_base<0UL,_Address_*,_false>._M_head_impl != (Address *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
    operator<<(out,(ct->work_address)._M_t.
                   super___uniq_ptr_impl<Address,_std::default_delete<Address>_>._M_t.
                   super__Tuple_impl<0UL,_Address_*,_std::default_delete<Address>_>.
                   super__Head_base<0UL,_Address_*,_false>._M_head_impl);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Contact& ct)
	{
		out << ct.name;
		if(ct.work_address)
		{
			out << ", " << *ct.work_address;
		}

		return out;
	}